

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rm_manager.cc
# Opt level: O0

RC __thiscall RM_Manager::CloseFile(RM_Manager *this,RM_FileHandle *fileHandle)

{
  undefined8 uVar1;
  RC RVar2;
  RC rc2;
  char *local_48;
  char *pData;
  undefined1 local_38 [4];
  PageNum page;
  PF_PageHandle ph;
  RC rc;
  RM_FileHandle *fileHandle_local;
  RM_Manager *this_local;
  
  PF_PageHandle::PF_PageHandle((PF_PageHandle *)local_38);
  if ((fileHandle->header_modified & 1U) == 1) {
    ph.pPageData._4_4_ = PF_FileHandle::GetFirstPage(&fileHandle->pfh,(PF_PageHandle *)local_38);
    if ((ph.pPageData._4_4_ != 0) ||
       (RVar2 = PF_PageHandle::GetPageNum((PF_PageHandle *)local_38,(PageNum *)((long)&pData + 4)),
       RVar2 != 0)) {
      this_local._4_4_ = ph.pPageData._4_4_;
      goto LAB_00108c4e;
    }
    ph.pPageData._4_4_ = PF_PageHandle::GetData((PF_PageHandle *)local_38,&local_48);
    if (ph.pPageData._4_4_ != 0) {
      this_local._4_4_ = PF_FileHandle::UnpinPage(&fileHandle->pfh,pData._4_4_);
      if (this_local._4_4_ == 0) {
        this_local._4_4_ = ph.pPageData._4_4_;
      }
      goto LAB_00108c4e;
    }
    *(undefined8 *)(local_48 + 0x10) = *(undefined8 *)&(fileHandle->header).bitmapOffset;
    uVar1 = *(undefined8 *)&(fileHandle->header).numPages;
    *(undefined8 *)local_48 = *(undefined8 *)&fileHandle->header;
    *(undefined8 *)(local_48 + 8) = uVar1;
    ph.pPageData._4_4_ = PF_FileHandle::MarkDirty(&fileHandle->pfh,pData._4_4_);
    if ((ph.pPageData._4_4_ != 0) ||
       (ph.pPageData._4_4_ = PF_FileHandle::UnpinPage(&fileHandle->pfh,pData._4_4_),
       ph.pPageData._4_4_ != 0)) {
      this_local._4_4_ = ph.pPageData._4_4_;
      goto LAB_00108c4e;
    }
    ph.pPageData._4_4_ = 0;
  }
  ph.pPageData._4_4_ = PF_Manager::CloseFile(this->pfm,&fileHandle->pfh);
  this_local._4_4_ = ph.pPageData._4_4_;
  if ((ph.pPageData._4_4_ == 0) &&
     (ph.pPageData._4_4_ = CleanUpFH(this,fileHandle), this_local._4_4_ = ph.pPageData._4_4_,
     ph.pPageData._4_4_ == 0)) {
    this_local._4_4_ = 0;
  }
LAB_00108c4e:
  PF_PageHandle::~PF_PageHandle((PF_PageHandle *)local_38);
  return this_local._4_4_;
}

Assistant:

RC RM_Manager::CloseFile  (RM_FileHandle &fileHandle) {
  RC rc;
  PF_PageHandle ph;
  PageNum page;
  char *pData;

  // If header was modified, put the first page into buffer again,
  // and update its contents, marking the page as dirty
  if(fileHandle.header_modified == true){
    if((rc = fileHandle.pfh.GetFirstPage(ph)) || ph.GetPageNum(page))
      return (rc);
    if((rc = ph.GetData(pData))){
      RC rc2;
      if((rc2 = fileHandle.pfh.UnpinPage(page)))
        return (rc2);
      return (rc);
    }
    memcpy(pData, &fileHandle.header, sizeof(struct RM_FileHeader));
    if((rc = fileHandle.pfh.MarkDirty(page)) || (rc = fileHandle.pfh.UnpinPage(page)))
      return (rc);

  }

  // Close the file
  if((rc = pfm.CloseFile(fileHandle.pfh)))
    return (rc);

  // Disassociate the fileHandle from an open file
  if((rc = CleanUpFH(fileHandle)))
    return (rc);

  return (0);
}